

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneHotEncoder.cpp
# Opt level: O0

Result * __thiscall
CoreML::OneHotEncoder::getUseSparse(Result *__return_storage_ptr__,OneHotEncoder *this,bool *state)

{
  bool bVar1;
  element_type *this_00;
  OneHotEncoder *this_01;
  OneHotEncoder *ohe;
  bool *state_local;
  OneHotEncoder *this_local;
  
  if (state != (bool *)0x0) {
    this_00 = std::
              __shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_Model).m_spec);
    this_01 = Specification::Model::mutable_onehotencoder(this_00);
    bVar1 = Specification::OneHotEncoder::outputsparse(this_01);
    *state = bVar1;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result OneHotEncoder::getUseSparse(bool *state) {
        if (state != nullptr) {
            auto ohe = m_spec->mutable_onehotencoder();
            *state = ohe->outputsparse();
        }
        return Result();
    }